

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

EndpointDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::EndpointDeclaration,soul::AST::Allocator&,soul::AST::Context,bool&,soul::EndpointType&>
          (PoolAllocator *this,Allocator *args,Context *args_1,bool *args_2,EndpointType *args_3)

{
  PoolItem *pPVar1;
  
  pPVar1 = allocateSpaceForObject(this,0x78);
  AST::EndpointDeclaration::EndpointDeclaration
            ((EndpointDeclaration *)&pPVar1->item,args,args_1,*args_2,*args_3);
  pPVar1->destructor =
       allocate<soul::AST::EndpointDeclaration,_soul::AST::Allocator_&,_soul::AST::Context,_bool_&,_soul::EndpointType_&>
       ::anon_class_1_0_00000001::__invoke;
  return (EndpointDeclaration *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }